

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

int __thiscall Escape::CGraph::copy(CGraph *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  size_t __n;
  
  newCGraph(this,*(VertexIdx *)dst,*(EdgeIdx *)(dst + 8));
  __n = *(long *)dst * 8 + 8;
  if (__n != 0) {
    memmove(this->offsets,*(void **)(dst + 0x10),__n);
  }
  if (*(long *)(dst + 8) != 0) {
    memmove(this->nbors,*(void **)(dst + 0x18),*(long *)(dst + 8) << 3);
  }
  return (int)this;
}

Assistant:

CGraph CGraph::copy() const {
    CGraph ret = newCGraph(nVertices, nEdges);
    std::copy(offsets, offsets + nVertices + 1, ret.offsets);
    std::copy(nbors, nbors + nEdges, ret.nbors);
    return ret;
}